

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::TestOnlyAddNodes
          (GraphCycles *this,uint32_t n)

{
  Rep *this_00;
  ulong uVar1;
  
  this_00 = this->rep_;
  uVar1 = (ulong)(this_00->nodes_).size_;
  if ((this_00->nodes_).capacity_ < n) {
    anon_unknown_0::Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>
    ::Grow(&this_00->nodes_,n);
  }
  (this_00->nodes_).size_ = n;
  for (; uVar1 < n; uVar1 = uVar1 + 1) {
    (this->rep_->nodes_).ptr_[uVar1] = (Node *)0x0;
  }
  return;
}

Assistant:

void GraphCycles::TestOnlyAddNodes(uint32_t n) {
  uint32_t old_size = rep_->nodes_.size();
  rep_->nodes_.resize(n);
  for (auto i = old_size; i < n; ++i) {
    rep_->nodes_[i] = nullptr;
  }
}